

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

int feat_set_subvecs(feat_t *fcb,int32 **subvecs)

{
  uint32 *puVar1;
  mfcc_t *pmVar2;
  bool bVar3;
  int *local_48;
  int32 *d_1;
  int32 *d;
  uint local_30;
  uint32 i;
  uint32 n_dim;
  uint32 n_sv;
  int32 **sv;
  int32 **subvecs_local;
  feat_t *fcb_local;
  
  if (subvecs == (int32 **)0x0) {
    subvecs_free(fcb->subvecs);
    ckd_free(fcb->sv_buf);
    ckd_free(fcb->sv_len);
    fcb->n_sv = 0;
    fcb->subvecs = (int32 **)0x0;
    fcb->sv_len = (uint32 *)0x0;
    fcb->sv_buf = (mfcc_t *)0x0;
    fcb->sv_dim = 0;
    fcb_local._4_4_ = 0;
  }
  else if (fcb->n_stream == 1) {
    i = 0;
    local_30 = 0;
    _n_dim = subvecs;
    while( true ) {
      bVar3 = false;
      if (_n_dim != (int32 **)0x0) {
        bVar3 = *_n_dim != (int32 *)0x0;
      }
      if (!bVar3) break;
      d_1 = *_n_dim;
      while( true ) {
        bVar3 = false;
        if (d_1 != (int32 *)0x0) {
          bVar3 = *d_1 != -1;
        }
        if (!bVar3) break;
        local_30 = local_30 + 1;
        d_1 = d_1 + 1;
      }
      i = i + 1;
      _n_dim = _n_dim + 1;
    }
    if (fcb->out_dim < local_30) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,0x137,
              "Total dimensionality of subvector specification %d > feature dimensionality %d\n",
              (ulong)local_30,(ulong)fcb->out_dim);
      fcb_local._4_4_ = -1;
    }
    else {
      fcb->n_sv = i;
      fcb->subvecs = subvecs;
      puVar1 = (uint32 *)
               __ckd_calloc__((ulong)i,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                              ,0x13d);
      fcb->sv_len = puVar1;
      pmVar2 = (mfcc_t *)
               __ckd_calloc__((ulong)local_30,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                              ,0x13e);
      fcb->sv_buf = pmVar2;
      fcb->sv_dim = local_30;
      for (d._4_4_ = 0; d._4_4_ < i; d._4_4_ = d._4_4_ + 1) {
        local_48 = subvecs[d._4_4_];
        while( true ) {
          bVar3 = false;
          if (local_48 != (int *)0x0) {
            bVar3 = *local_48 != -1;
          }
          if (!bVar3) break;
          fcb->sv_len[d._4_4_] = fcb->sv_len[d._4_4_] + 1;
          local_48 = local_48 + 1;
        }
      }
      fcb_local._4_4_ = 0;
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x127,"Subvector specifications require single-stream features!");
    fcb_local._4_4_ = -1;
  }
  return fcb_local._4_4_;
}

Assistant:

int
feat_set_subvecs(feat_t *fcb, int32 **subvecs)
{
    int32 **sv;
    uint32 n_sv, n_dim, i;

    if (subvecs == NULL) {
        subvecs_free(fcb->subvecs);
        ckd_free(fcb->sv_buf);
        ckd_free(fcb->sv_len);
        fcb->n_sv = 0;
        fcb->subvecs = NULL;
        fcb->sv_len = NULL;
        fcb->sv_buf = NULL;
        fcb->sv_dim = 0;
        return 0;
    }

    if (fcb->n_stream != 1) {
        E_ERROR("Subvector specifications require single-stream features!");
        return -1;
    }

    n_sv = 0;
    n_dim = 0;
    for (sv = subvecs; sv && *sv; ++sv) {
        int32 *d;

        for (d = *sv; d && *d != -1; ++d) {
            ++n_dim;
        }
        ++n_sv;
    }
    if (n_dim > feat_dimension(fcb)) {
        E_ERROR("Total dimensionality of subvector specification %d "
                "> feature dimensionality %d\n", n_dim, feat_dimension(fcb));
        return -1;
    }

    fcb->n_sv = n_sv;
    fcb->subvecs = subvecs;
    fcb->sv_len = (uint32 *)ckd_calloc(n_sv, sizeof(*fcb->sv_len));
    fcb->sv_buf = (mfcc_t *)ckd_calloc(n_dim, sizeof(*fcb->sv_buf));
    fcb->sv_dim = n_dim;
    for (i = 0; i < n_sv; ++i) {
        int32 *d;
        for (d = subvecs[i]; d && *d != -1; ++d) {
            ++fcb->sv_len[i];
        }
    }

    return 0;
}